

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_next(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  int iVar2;
  bool local_a5;
  TValue *pTStack_a0;
  TRef tmp;
  cTValue *keyv;
  RecordIndex ix;
  TRef tab;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  ix.oldv._0_4_ = *J->base;
  if (((uint)ix.oldv & 0x1f000000) == 0xb000000) {
    ix.idxchain = (uint)ix.oldv;
    if ((J->base[1] & 0x1f000000) == 0) {
      ix.oldv._4_4_ = lj_ir_kint(J,0);
      pTStack_a0 = (TValue *)&J[-1].penalty[0x32].val;
    }
    else {
      TVar1 = recff_tmpref(J,J->base[1],1);
      ix.oldv._4_4_ = lj_ir_call(J,IRCALL_lj_tab_keyindex,(ulong)(uint)ix.idxchain,(ulong)TVar1);
      pTStack_a0 = rd->argv + 1;
    }
    ix.tabv.u32.lo = lj_tab_keyindex((GCtab *)(rd->argv->u64 & 0x7fffffffffff),pTStack_a0);
    local_a5 = false;
    if ((J->framedepth != 0) && (local_a5 = false, (J->L->base[-1].u64 & 3) == 0)) {
      local_a5 = (*(uint *)(J->L->base[-1].u64 - 4) >> 0x18) - 1 < 2;
    }
    ix.mt = (TRef)local_a5;
    ix.val = 0;
    iVar2 = lj_record_next(J,(RecordIndex *)&keyv);
    rd->nres = (long)iVar2;
    *J->base = ix.oldv._4_4_;
    J->base[1] = ix.tab;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_next(jit_State *J, RecordFFData *rd)
{
#if LJ_BE
  /* YAGNI: Disabled on big-endian due to issues with lj_vm_next,
  ** IR_HIOP, RID_RETLO/RID_RETHI and ra_destpair.
  */
  recff_nyi(J, rd);
#else
  TRef tab = J->base[0];
  if (tref_istab(tab)) {
    RecordIndex ix;
    cTValue *keyv;
    ix.tab = tab;
    if (tref_isnil(J->base[1])) {  /* Shortcut for start of traversal. */
      ix.key = lj_ir_kint(J, 0);
      keyv = niltvg(J2G(J));
    } else {
      TRef tmp = recff_tmpref(J, J->base[1], IRTMPREF_IN1);
      ix.key = lj_ir_call(J, IRCALL_lj_tab_keyindex, tab, tmp);
      keyv = &rd->argv[1];
    }
    copyTV(J->L, &ix.tabv, &rd->argv[0]);
    ix.keyv.u32.lo = lj_tab_keyindex(tabV(&ix.tabv), keyv);
    /* Omit the value, if not used by the caller. */
    ix.idxchain = (J->framedepth && frame_islua(J->L->base-1) &&
		   bc_b(frame_pc(J->L->base-1)[-1])-1 < 2);
    ix.mobj = 0;  /* We don't need the next index. */
    rd->nres = lj_record_next(J, &ix);
    J->base[0] = ix.key;
    J->base[1] = ix.val;
  }  /* else: Interpreter will throw. */
#endif
}